

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int mbedtls_asn1_get_bool(uchar **p,uchar *end,int *val)

{
  size_t local_38;
  size_t len;
  uint *puStack_28;
  int ret;
  int *val_local;
  uchar *end_local;
  uchar **p_local;
  
  puStack_28 = (uint *)val;
  val_local = (int *)end;
  end_local = (uchar *)p;
  p_local._4_4_ = mbedtls_asn1_get_tag(p,end,&local_38,1);
  if (p_local._4_4_ == 0) {
    if (local_38 == 1) {
      *puStack_28 = (uint)(**(char **)end_local != '\0');
      *(long *)end_local = *(long *)end_local + 1;
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = -100;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_get_bool( unsigned char **p,
                   const unsigned char *end,
                   int *val )
{
    int ret;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len, MBEDTLS_ASN1_BOOLEAN ) ) != 0 )
        return( ret );

    if( len != 1 )
        return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );

    *val = ( **p != 0 ) ? 1 : 0;
    (*p)++;

    return( 0 );
}